

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Port * __thiscall
kratos::Generator::port(Generator *this,EnumPort *port,string *port_name,bool check_param)

{
  int iVar1;
  undefined4 extraout_var;
  element_type *new_var;
  element_type *peVar2;
  enable_shared_from_this<kratos::Enum> local_60;
  undefined1 local_4c [12];
  undefined1 local_40 [8];
  shared_ptr<kratos::EnumPort> p;
  Enum *enum_type;
  bool check_param_local;
  string *port_name_local;
  EnumPort *port_local;
  Generator *this_local;
  
  iVar1 = (*(port->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2c])();
  p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar1);
  local_4c._4_8_ = this;
  local_4c._0_4_ = Port::port_direction(&port->super_Port);
  std::enable_shared_from_this<kratos::Enum>::shared_from_this(&local_60);
  std::
  make_shared<kratos::EnumPort,kratos::Generator*,kratos::PortDirection,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>>
            ((Generator **)local_40,(PortDirection *)(local_4c + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c,
             (shared_ptr<kratos::Enum> *)port_name);
  std::shared_ptr<kratos::Enum>::~shared_ptr((shared_ptr<kratos::Enum> *)&local_60);
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumPort>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::EnumPort> *)local_40);
  new_var = std::__shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  Var::copy_meta_data((Var *)port,(Var *)new_var,check_param);
  peVar2 = std::__shared_ptr_access<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_40);
  std::shared_ptr<kratos::EnumPort>::~shared_ptr((shared_ptr<kratos::EnumPort> *)local_40);
  return &peVar2->super_Port;
}

Assistant:

Port &Generator::port(const EnumPort &port, const std::string &port_name, bool check_param) {
    auto *enum_type = const_cast<Enum *>(port.enum_type());
    auto p = std::make_shared<EnumPort>(this, port.port_direction(), port_name,
                                        enum_type->shared_from_this());
    add_port_name(port_name);
    vars_.emplace(port_name, p);

    port.copy_meta_data(p.get(), check_param);

    return *p;
}